

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alpha_processing.c
# Opt level: O0

void ApplyAlphaMultiply4444_C(uint8_t *rgba4444,int w,int h,int stride,int rg_byte_pos)

{
  byte bVar1;
  uint8_t x;
  byte bVar2;
  uint8_t uVar3;
  byte bVar4;
  byte bVar5;
  uint32_t m;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  uint in_R8D;
  uint8_t b;
  uint8_t g;
  uint8_t r;
  uint32_t mult;
  uint8_t a;
  uint32_t ba;
  uint32_t rg;
  int i;
  undefined4 local_1c;
  undefined4 local_10;
  undefined8 local_8;
  
  local_10 = in_EDX;
  local_8 = in_RDI;
  while (0 < local_10) {
    for (local_1c = 0; local_1c < in_ESI; local_1c = local_1c + 1) {
      uVar3 = *(uint8_t *)(local_8 + (int)(local_1c * 2 + in_R8D));
      bVar5 = *(byte *)(local_8 + (int)(local_1c * 2 + (in_R8D ^ 1)));
      bVar1 = bVar5 & 0xf;
      m = (uint)bVar1 * 0x1111;
      x = dither_hi(uVar3);
      bVar2 = multiply(x,m);
      uVar3 = dither_lo(uVar3);
      bVar4 = multiply(uVar3,m);
      uVar3 = dither_hi(bVar5);
      bVar5 = multiply(uVar3,m);
      *(byte *)(local_8 + (int)(local_1c * 2 + in_R8D)) =
           bVar2 & 0xf0 | (byte)((int)(uint)bVar4 >> 4);
      *(byte *)(local_8 + (int)(local_1c * 2 + (in_R8D ^ 1))) = bVar5 & 0xf0 | bVar1;
    }
    local_8 = local_8 + in_ECX;
    local_10 = local_10 + -1;
  }
  return;
}

Assistant:

static WEBP_INLINE void ApplyAlphaMultiply4444_C(uint8_t* rgba4444,
                                                 int w, int h, int stride,
                                                 int rg_byte_pos /* 0 or 1 */) {
  while (h-- > 0) {
    int i;
    for (i = 0; i < w; ++i) {
      const uint32_t rg = rgba4444[2 * i + rg_byte_pos];
      const uint32_t ba = rgba4444[2 * i + (rg_byte_pos ^ 1)];
      const uint8_t a = ba & 0x0f;
      const uint32_t mult = MULTIPLIER(a);
      const uint8_t r = multiply(dither_hi(rg), mult);
      const uint8_t g = multiply(dither_lo(rg), mult);
      const uint8_t b = multiply(dither_hi(ba), mult);
      rgba4444[2 * i + rg_byte_pos] = (r & 0xf0) | ((g >> 4) & 0x0f);
      rgba4444[2 * i + (rg_byte_pos ^ 1)] = (b & 0xf0) | a;
    }
    rgba4444 += stride;
  }
}